

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_sock_sendfile_from_fd(int fd,fio_packet_s *packet)

{
  ssize_t sVar1;
  ssize_t sent;
  fio_packet_s *packet_local;
  int fd_local;
  
  sVar1 = sendfile64(fd,(int)(packet->data).fd,(__off64_t *)&packet->offset,packet->length);
  if (sVar1 < 0) {
    packet_local._4_4_ = -1;
  }
  else {
    packet->length = packet->length - sVar1;
    if (packet->length == 0) {
      fio_sock_packet_rotate_unsafe((long)fd);
    }
    packet_local._4_4_ = (int)sVar1;
  }
  return packet_local._4_4_;
}

Assistant:

static int fio_sock_sendfile_from_fd(int fd, fio_packet_s *packet) {
  ssize_t sent;
  sent =
      sendfile64(fd, packet->data.fd, (off_t *)&packet->offset, packet->length);
  if (sent < 0)
    return -1;
  packet->length -= sent;
  if (!packet->length)
    fio_sock_packet_rotate_unsafe(fd);
  return sent;
}